

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O2

AssertionResult __thiscall
testing::internal::CmpHelperFloatingPointEQ<double>
          (internal *this,char *lhs_expression,char *rhs_expression,double lhs_value,
          double rhs_value)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  AssertionResult AVar3;
  FloatingPoint<double> rhs;
  FloatingPoint<double> lhs;
  stringstream rhs_ss;
  stringstream lhs_ss;
  string local_378;
  string local_358;
  FloatingPointUnion local_338;
  FloatingPointUnion local_330;
  stringstream local_328 [16];
  long local_318;
  undefined8 auStack_310 [46];
  stringstream local_1a0 [16];
  long local_190;
  undefined8 auStack_188 [46];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar2
  ;
  
  local_338.value_ = rhs_value;
  local_330.value_ = lhs_value;
  bVar1 = FloatingPoint<double>::AlmostEquals
                    ((FloatingPoint<double> *)&local_330,(FloatingPoint<double> *)&local_338);
  if (bVar1) {
    AVar3 = AssertionSuccess();
    sVar2 = AVar3.message_.ptr_;
  }
  else {
    std::__cxx11::stringstream::stringstream(local_1a0);
    *(undefined8 *)((long)auStack_188 + *(long *)(local_190 + -0x18)) = 0x11;
    std::ostream::_M_insert<double>(lhs_value);
    std::__cxx11::stringstream::stringstream(local_328);
    *(undefined8 *)((long)auStack_310 + *(long *)(local_318 + -0x18)) = 0x11;
    std::ostream::_M_insert<double>(rhs_value);
    StringStreamToString(&local_358,(stringstream *)local_1a0);
    StringStreamToString(&local_378,(stringstream *)local_328);
    EqFailure(this,lhs_expression,rhs_expression,&local_358,&local_378,false);
    std::__cxx11::string::~string((string *)&local_378);
    std::__cxx11::string::~string((string *)&local_358);
    std::__cxx11::stringstream::~stringstream(local_328);
    std::__cxx11::stringstream::~stringstream(local_1a0);
    sVar2.ptr_ = extraout_RDX;
  }
  AVar3.message_.ptr_ = sVar2.ptr_;
  AVar3._0_8_ = this;
  return AVar3;
}

Assistant:

AssertionResult CmpHelperFloatingPointEQ(const char* lhs_expression,
                                         const char* rhs_expression,
                                         RawType lhs_value,
                                         RawType rhs_value) {
  const FloatingPoint<RawType> lhs(lhs_value), rhs(rhs_value);

  if (lhs.AlmostEquals(rhs)) {
    return AssertionSuccess();
  }

  ::std::stringstream lhs_ss;
  lhs_ss << std::setprecision(std::numeric_limits<RawType>::digits10 + 2)
         << lhs_value;

  ::std::stringstream rhs_ss;
  rhs_ss << std::setprecision(std::numeric_limits<RawType>::digits10 + 2)
         << rhs_value;

  return EqFailure(lhs_expression,
                   rhs_expression,
                   StringStreamToString(&lhs_ss),
                   StringStreamToString(&rhs_ss),
                   false);
}